

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unicodeOpen(sqlite3_tokenizer *p,char *aInput,int nInput,sqlite3_tokenizer_cursor **pp)

{
  int iVar1;
  int iVar2;
  sqlite3_tokenizer_cursor *psVar3;
  size_t sVar4;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    psVar3 = (sqlite3_tokenizer_cursor *)sqlite3Malloc(0x30);
  }
  else {
    psVar3 = (sqlite3_tokenizer_cursor *)0x0;
  }
  if (psVar3 == (sqlite3_tokenizer_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar3->pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[1].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[4].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[5].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[2].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[3].pTokenizer = (sqlite3_tokenizer *)0x0;
    psVar3[1].pTokenizer = (sqlite3_tokenizer *)aInput;
    iVar1 = 0;
    iVar2 = 0;
    if ((aInput != (char *)0x0) && (iVar2 = nInput, nInput < 0)) {
      sVar4 = strlen(aInput);
      iVar2 = (int)sVar4;
    }
    *(int *)&psVar3[2].pTokenizer = iVar2;
    *pp = psVar3;
  }
  return iVar1;
}

Assistant:

static int unicodeOpen(
  sqlite3_tokenizer *p,           /* The tokenizer */
  const char *aInput,             /* Input string */
  int nInput,                     /* Size of string aInput in bytes */
  sqlite3_tokenizer_cursor **pp   /* OUT: New cursor object */
){
  unicode_cursor *pCsr;

  pCsr = (unicode_cursor *)sqlite3_malloc(sizeof(unicode_cursor));
  if( pCsr==0 ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(unicode_cursor));

  pCsr->aInput = (const unsigned char *)aInput;
  if( aInput==0 ){
    pCsr->nInput = 0;
  }else if( nInput<0 ){
    pCsr->nInput = (int)strlen(aInput);
  }else{
    pCsr->nInput = nInput;
  }

  *pp = &pCsr->base;
  UNUSED_PARAMETER(p);
  return SQLITE_OK;
}